

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcold.c
# Opt level: O2

int ffpcnd(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
          double *array,double nulvalue,int *status)

{
  uint uVar1;
  tcolumn *ptVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  LONGLONG LVar8;
  long lVar9;
  ulong nelem_00;
  long lVar10;
  long lVar11;
  double *pdVar12;
  ulong nelem_01;
  bool bVar13;
  
  iVar4 = *status;
  if (iVar4 < 1) {
    if (fptr->HDUposition == fptr->Fptr->curhdu) {
      if ((fptr->Fptr->datastart == -1) && (iVar4 = ffrdef(fptr,status), 0 < iVar4)) {
LAB_00195865:
        return *status;
      }
    }
    else {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    ptVar2 = fptr->Fptr->tableptr;
    uVar1 = ptVar2[(long)colnum + -1].tdatatype;
    if ((int)uVar1 < 1) {
      LVar8 = firstelem + nelem + -1;
    }
    else {
      LVar8 = ptVar2[(long)colnum + -1].trepeat;
    }
    uVar5 = -uVar1;
    if (0 < (int)uVar1) {
      uVar5 = uVar1;
    }
    lVar9 = LVar8 << (0x52 < uVar5);
    if (((int)uVar1 < 0) &&
       (iVar4 = ffpcld(fptr,colnum,firstrow,firstelem,nelem,array,status), 0 < iVar4)) {
      if (*status != 0x19c) {
        return *status;
      }
      *status = 0;
    }
    lVar10 = (firstrow + -1) * lVar9 + firstelem;
    nelem_00 = 0;
    if (nelem < 1) {
      nelem = nelem_00;
    }
    nelem_01 = 0;
    bVar3 = false;
    uVar7 = nelem;
    lVar11 = lVar10;
    pdVar12 = array;
    while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
      if ((*pdVar12 != nulvalue) || (NAN(*pdVar12) || NAN(nulvalue))) {
        if ((nelem_01 != 0) &&
           (lVar6 = (long)(~nelem_01 + lVar11) / lVar9,
           iVar4 = ffpcluc(fptr,colnum,lVar6 + 1,(-lVar9 * lVar6 - nelem_01) + lVar11,nelem_01,
                           status), 0 < iVar4)) goto LAB_00195865;
        nelem_00 = nelem_00 + 1;
        nelem_01 = 0;
      }
      else {
        if ((nelem_00 != 0 && 0 < (int)uVar1) &&
           (lVar6 = (long)(~nelem_00 + lVar11) / lVar9,
           iVar4 = ffpcld(fptr,colnum,lVar6 + 1,(-lVar9 * lVar6 - nelem_00) + lVar11,nelem_00,
                          pdVar12 + -nelem_00,status), 0 < iVar4)) {
          if (*status != 0x19c) {
            return *status;
          }
          *status = 0;
          bVar3 = true;
        }
        nelem_01 = nelem_01 + 1;
        nelem_00 = 0;
      }
      pdVar12 = pdVar12 + 1;
      lVar11 = lVar11 + 1;
    }
    if (nelem_00 == 0) {
      if (nelem_01 != 0) {
        lVar11 = (long)((nelem - nelem_01) + lVar10 + -1) / lVar9;
        ffpcluc(fptr,colnum,lVar11 + 1,((nelem - nelem_01) + lVar10) - lVar11 * lVar9,nelem_01,
                status);
      }
    }
    else if (0 < (int)uVar1) {
      lVar6 = nelem - nelem_00;
      lVar11 = (lVar10 + lVar6 + -1) / lVar9;
      ffpcld(fptr,colnum,lVar11 + 1,(lVar6 + lVar10) - lVar9 * lVar11,nelem_00,array + lVar6,status)
      ;
    }
    iVar4 = *status;
    if (bVar3 && iVar4 < 1) {
      *status = 0x19c;
      iVar4 = 0x19c;
    }
  }
  return iVar4;
}

Assistant:

int ffpcnd( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of values to write               */
            double *array,   /* I - array of values to write                */
            double nulvalue, /* I - value used to flag undefined pixels     */
            int  *status)    /* IO - error status                           */
/*
  Write an array of elements to the specified column of a table.  Any input
  pixels equal to the value of nulvalue will be replaced by the appropriate
  null value in the output FITS file. 

  The input array of values will be converted to the datatype of the column 
  and will be inverse-scaled by the FITS TSCALn and TZEROn values if necessary
*/
{
    tcolumn *colptr;
    LONGLONG  ngood = 0, nbad = 0, ii;
    LONGLONG repeat, first, fstelm, fstrow;
    int tcode, overflow = 0;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);
    }

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */

    tcode  = colptr->tdatatype;

    if (tcode > 0)
       repeat = colptr->trepeat;  /* repeat count for this column */
    else
       repeat = firstelem -1 + nelem;  /* variable length arrays */

    if (abs(tcode) >= TCOMPLEX)
    { /* treat complex columns as pairs of numbers */
        repeat *= 2;
    }

    /* if variable length array, first write the whole input vector, 
       then go back and fill in the nulls */
    if (tcode < 0) {
      if (ffpcld(fptr, colnum, firstrow, firstelem, nelem, array, status) > 0) {
	if (*status == NUM_OVERFLOW) 
	{
	  /* ignore overflows, which are possibly the null pixel values */
	  /*  overflow = 1;   */
	  *status = 0;
	} else { 
          return(*status);
	}
      }
    }

    /* absolute element number in the column */
    first = (firstrow - 1) * repeat + firstelem;

    for (ii = 0; ii < nelem; ii++)
    {
      if (array[ii] != nulvalue)  /* is this a good pixel? */
      {
         if (nbad)  /* write previous string of bad pixels */
         {
            fstelm = ii - nbad + first;  /* absolute element number */
            fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
            fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

            /* call ffpcluc, not ffpclu, in case we are writing to a
	       complex ('C') binary table column */
            if (ffpcluc(fptr, colnum, fstrow, fstelm, nbad, status) > 0)
                return(*status);

            nbad=0;
         }

         ngood = ngood +1;  /* the consecutive number of good pixels */
      }
      else
      {
         if (ngood)  /* write previous string of good pixels */
         {
            fstelm = ii - ngood + first;  /* absolute element number */
            fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
            fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

            if (tcode > 0) {  /* variable length arrays have already been written */
              if (ffpcld(fptr, colnum, fstrow, fstelm, ngood, &array[ii-ngood],
                status) > 0) {
		if (*status == NUM_OVERFLOW) 
		{
		  overflow = 1;
		  *status = 0;
		} else {
                  return(*status);
		}
	      }
            }
            ngood=0;
         }

         nbad = nbad +1;  /* the consecutive number of bad pixels */
      }
    }

    /* finished loop;  now just write the last set of pixels */

    if (ngood)  /* write last string of good pixels */
    {
      fstelm = ii - ngood + first;  /* absolute element number */
      fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
      fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

      if (tcode > 0) {  /* variable length arrays have already been written */
        ffpcld(fptr, colnum, fstrow, fstelm, ngood, &array[ii-ngood], status);
      }
    }
    else if (nbad) /* write last string of bad pixels */
    {
      fstelm = ii - nbad + first;  /* absolute element number */
      fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
      fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */
      ffpcluc(fptr, colnum, fstrow, fstelm, nbad, status);
    }

    if (*status <= 0) {
      if (overflow) {
        *status = NUM_OVERFLOW;
      }
    }

    return(*status);
}